

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_price_field_Test::TestBody
          (PriceUpdateDecoderTest_test_decode_price_field_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e8;
  Message local_e0;
  double local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  Message local_b8;
  Type local_b0 [2];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  PriceField price_field;
  allocator<char> local_71;
  string local_70 [32];
  FieldDef local_50 [8];
  FieldDef field_def;
  uint64_t priceTimesMillion;
  double price;
  PriceUpdateDecoderTest_test_decode_price_field_Test *this_local;
  
  priceTimesMillion = 0x4045ba732df505d1;
  price = (double)this;
  bidfx_public_api::tools::Varint::WriteU64
            ((OutputStream *)&(this->super_PriceUpdateDecoderTest).field_0x18,0x2971880);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"field",&local_71);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_50,1,0x44,local_70,0x56,6);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            ((ByteBuffer *)&gtest_ar.message_,
             (FieldDef *)&(this->super_PriceUpdateDecoderTest).buffer);
  local_b0[1] = 2;
  local_b0[0] = bidfx_public_api::price::PriceField::GetType();
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((EqHelper<false> *)local_a8,"PriceField::DOUBLE","price_field.GetType()",local_b0 + 1,
             local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_d8 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_d0,"price","price_field.GetDouble()",
             (double *)&priceTimesMillion,&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&gtest_ar.message_);
  FieldDef::~FieldDef(local_50);
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_price_field)
{
    double price = 43.45664;
    uint64_t priceTimesMillion = 43456640L;
    Varint::WriteU64(buffer, priceTimesMillion);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::DOUBLE, "field", FieldEncodingEnum::VARINT, 6);
    PriceField price_field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::DOUBLE, price_field.GetType());
    EXPECT_EQ(price, price_field.GetDouble());
}